

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall clipp::parser::try_match(parser *this,arg_string *arg)

{
  child_t<clipp::parameter,_clipp::group> *pcVar1;
  bool bVar2;
  bool bVar3;
  subrange sVar4;
  arg_string local_1e0;
  arg_string local_1c0;
  arg_string local_1a0;
  match_t local_180;
  scoped_dfs_traverser local_c0;
  
  pcVar1 = (this->pos_).pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
  if (((pcVar1->type_ == param) &&
      (bVar2 = group::child_t<clipp::parameter,_clipp::group>::blocking(pcVar1), bVar2)) &&
     (pcVar1 = (this->pos_).pos_.stack_.
               super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current,
     (pcVar1->m_).param.greedy_ == true)) {
    sVar4 = parameter::match((parameter *)pcVar1,arg);
    if ((sVar4.at_ != 0xffffffffffffffff) && (sVar4.length_ == arg->_M_string_length)) {
      std::__cxx11::string::string((string *)&local_1e0,(string *)arg);
      detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_c0,&this->pos_);
      detail::match_t::match_t(&local_180,&local_1e0,&local_c0);
      add_match(this,&local_180);
      detail::match_t::~match_t(&local_180);
      detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      return true;
    }
  }
  bVar2 = try_match_full<clipp::detail::select_flags>(this,arg,(select_flags *)&local_180);
  bVar3 = true;
  if ((!bVar2) && (bVar2 = try_match_joined_flags(this,arg), !bVar2)) {
    std::__cxx11::string::string((string *)&local_1a0,(string *)arg);
    bVar2 = try_match_joined_sequence<clipp::detail::select_flags>
                      (this,&local_1a0,(select_flags *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    if ((!bVar2) &&
       (bVar2 = try_match_full<clipp::detail::select_values>(this,arg,(select_values *)&local_180),
       !bVar2)) {
      std::__cxx11::string::string((string *)&local_1c0,(string *)arg);
      bVar2 = try_match_joined_sequence<clipp::detail::select_all>
                        (this,&local_1c0,(select_all *)&local_180);
      std::__cxx11::string::~string((string *)&local_1c0);
      if (!bVar2) {
        bVar3 = try_match_joined_params(this,arg);
      }
    }
  }
  return bVar3;
}

Assistant:

bool try_match(const arg_string& arg)
    {
        //match greedy parameters before everything else
        if(pos_->is_param() && pos_->blocking() && pos_->as_param().greedy()) {
            const auto match = pos_->as_param().match(arg);
            if(match && match.length() == arg.size()) {
                add_match(detail::match_t{arg,pos_});
                return true;
            }
        }

        //try flags first (alone, joinable or strict sequence)
        if(try_match_full(arg, detail::select_flags{})) return true;
        if(try_match_joined_flags(arg)) return true;
        if(try_match_joined_sequence(arg, detail::select_flags{})) return true;
        //try value params (alone or strict sequence)
        if(try_match_full(arg, detail::select_values{})) return true;
        if(try_match_joined_sequence(arg, detail::select_all{})) return true;
        //try joinable params + values in any order
        if(try_match_joined_params(arg)) return true;
        return false;
    }